

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O3

Span<const_char> script::Expr(Span<const_char> *sp)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  long in_FS_OFFSET;
  Span<const_char> SVar9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = sp->m_data;
  sVar4 = sp->m_size;
  pcVar6 = pcVar3;
  if (sVar4 != 0) {
    iVar8 = 0;
    pcVar5 = pcVar3;
    sVar7 = sVar4;
    do {
      cVar1 = *pcVar5;
      if ((cVar1 == '{') || (cVar1 == '(')) {
        iVar8 = iVar8 + 1;
      }
      else if (iVar8 == 0) {
        pcVar6 = pcVar5;
        if (((cVar1 == ')') || (cVar1 == ',')) || (iVar8 = 0, cVar1 == '}')) break;
      }
      else if ((cVar1 == '}') || (cVar1 == ')')) {
        iVar8 = iVar8 + -1;
      }
      pcVar5 = pcVar5 + 1;
      sVar7 = sVar7 - 1;
      pcVar6 = pcVar3 + sVar4;
    } while (sVar7 != 0);
  }
  SVar9.m_size = (long)pcVar6 - (long)pcVar3;
  sp->m_data = pcVar6;
  sp->m_size = sVar4 - SVar9.m_size;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  SVar9.m_data = pcVar3;
  return SVar9;
}

Assistant:

Span<const char> Expr(Span<const char>& sp)
{
    int level = 0;
    auto it = sp.begin();
    while (it != sp.end()) {
        if (*it == '(' || *it == '{') {
            ++level;
        } else if (level && (*it == ')' || *it == '}')) {
            --level;
        } else if (level == 0 && (*it == ')' || *it == '}' || *it == ',')) {
            break;
        }
        ++it;
    }
    Span<const char> ret = sp.first(it - sp.begin());
    sp = sp.subspan(it - sp.begin());
    return ret;
}